

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O3

void anon_unknown.dwarf_8b46::do_encode_decode_test<unsigned_char>(uchar ekey)

{
  key_encoder *pkVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  key_encoder *local_58;
  ulong local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  internal local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  byte local_29;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Stack_28;
  uchar akey;
  AssertHelper local_20;
  uchar local_11 [8];
  uchar ekey_local;
  
  auVar3 = ZEXT816(0) << 0x40;
  local_58 = (key_encoder *)local_158;
  local_98 = ZEXT1632(auVar3);
  local_118 = ZEXT1632(auVar3);
  local_158 = ZEXT1632(auVar3);
  local_50 = 0x100;
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_138 = local_158;
  local_f8 = local_118;
  local_d8 = local_118;
  local_b8 = local_118;
  local_78 = local_98;
  local_11[0] = ekey;
  unodb::key_encoder::ensure_available(local_58,1);
  pkVar1 = local_58;
  _Stack_28._M_head_impl = local_48._M_head_impl + 1;
  local_58->ibuf[(long)local_48._M_head_impl] = ekey;
  local_20.data_ = (AssertHelperData *)0x1;
  local_48._M_head_impl = _Stack_28._M_head_impl;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_40,"(kv.size_bytes())","(sizeof(ekey))",(unsigned_long *)&stack0xffffffffffffffd8
             ,(unsigned_long *)&local_20);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (_Stack_28._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)_Stack_28._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  local_29 = pkVar1->ibuf[0];
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            (local_40,"(akey)","(ekey)",&local_29,local_11);
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xffffffffffffffd8);
    if (local_38 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_38->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_key_encode_decode.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&stack0xffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )_Stack_28._M_head_impl !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)_Stack_28._M_head_impl + 8))();
    }
  }
  if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_38,local_38);
  }
  if (0x100 < local_50) {
    free(local_58);
  }
  return;
}

Assistant:

void do_encode_decode_test(const T ekey) {
  unodb::key_encoder enc{};
  enc.encode(ekey);
  const unodb::key_view kv = enc.get_key_view();   // encode
  UNODB_EXPECT_EQ(kv.size_bytes(), sizeof(ekey));  // check size
  // decode check
  unodb::key_decoder dec{kv};
  T akey;
  dec.decode(akey);
  UNODB_EXPECT_EQ(akey, ekey);
}